

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O0

double __thiscall bezier::Vec2::operator[](Vec2 *this,size_t axis)

{
  size_t axis_local;
  Vec2 *this_local;
  
  if (axis < 2) {
    if (axis == 0) {
      this_local = (Vec2 *)this->x;
    }
    else if (axis == 1) {
      this_local = (Vec2 *)this->y;
    }
    else {
      this_local = (Vec2 *)0x0;
    }
    return (double)this_local;
  }
  __assert_fail("axis < Vec2::size",
                "/workspace/llm4binary/github/license_c_cmakelists/oysteinmyrmo[P]bezier/include/bezier/bezier.h"
                ,0xe5,"double bezier::Vec2::operator[](size_t) const");
}

Assistant:

double operator[](size_t axis) const
        {
            assert(axis < Vec2::size);
            switch (axis)
            {
                case 0:
                    return x;
                case 1:
                    return y;
                default:
                    return 0;
            }
        }